

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_insn_decoder.c
# Opt level: O1

int handle_erratum_skd022(pt_insn_decoder *decoder)

{
  uint64_t uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  pt_insn_ext iext;
  pt_insn insn;
  pt_insn_ext local_44;
  pt_insn local_38;
  
  local_38.mode = decoder->mode;
  local_38.ip = decoder->ip;
  iVar2 = pt_insn_decode(&local_38,&local_44,decoder->image,&decoder->asid);
  bVar4 = local_44.iclass - PTI_INST_VMLAUNCH < 2;
  if (bVar4 && -1 < iVar2) {
    uVar1 = (decoder->event).variant.async_disabled.ip;
    (decoder->event).type = ptev_disabled;
    (decoder->event).variant.enabled.ip = uVar1;
    uVar3 = 1;
  }
  else {
    uVar3 = (uint)(bVar4 && -1 < iVar2);
  }
  return uVar3;
}

Assistant:

static inline int handle_erratum_skd022(struct pt_insn_decoder *decoder)
{
	struct pt_event *ev;
	uint64_t ip;
	int errcode;

	if (!decoder)
		return -pte_internal;

	errcode = check_erratum_skd022(decoder);
	if (errcode <= 0)
		return errcode;

	/* We turn the async disable into a sync disable.  It will be processed
	 * after decoding the instruction.
	 */
	ev = &decoder->event;

	ip = ev->variant.async_disabled.ip;

	ev->type = ptev_disabled;
	ev->variant.disabled.ip = ip;

	return 1;
}